

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# offset64_test.cpp
# Opt level: O1

void flatbuffers::tests::Offset64NestedFlatBuffer(void)

{
  bool expval;
  ushort uVar1;
  uint *puVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_> off;
  long lVar5;
  int *piVar6;
  uoffset_t uVar7;
  Offset<flatbuffers::String> OVar8;
  uchar *v;
  vector<unsigned_char,_std::allocator<unsigned_char>_> nested_data;
  FlatBufferBuilderImpl<true> local_108;
  uchar *local_88;
  long local_80;
  long local_78;
  VerifierTemplate<false> local_70;
  
  local_108.buf_.allocator_ = (Allocator *)0x0;
  local_108.buf_.own_allocator_ = false;
  local_108.buf_.initial_size_ = 0x400;
  local_108.buf_.max_size_ = 0x7fffffffffffffff;
  local_108.buf_.buffer_minalign_ = 8;
  local_108.length_of_64_bit_region_ = 0;
  local_108.nested = false;
  local_108.finished = false;
  local_108.buf_.reserved_ = 0;
  local_108.buf_.size_ = 0;
  local_108.buf_.buf_ = (uint8_t *)0x0;
  local_108.buf_.cur_._0_6_ = 0;
  local_108.buf_.cur_._6_2_ = 0;
  local_108.buf_.scratch_._0_6_ = 0;
  local_108.buf_.scratch_._6_2_ = 0;
  local_108.num_field_loc = 0;
  local_108.max_voffset_ = 0;
  local_108.minalign_ = 1;
  local_108.force_defaults_ = false;
  local_108.dedup_vtables_ = true;
  local_108.string_pool = (StringOffsetMap *)0x0;
  FlatBufferBuilderImpl<true>::CreateStringImpl(&local_108,"nested: some near string",0x18);
  OVar8.o = (int)local_108.buf_.size_ - (int)local_108.length_of_64_bit_region_;
  FlatBufferBuilderImpl<true>::NotNested(&local_108);
  local_108.nested = true;
  uVar7 = (int)local_108.buf_.size_ - (int)local_108.length_of_64_bit_region_;
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_long>>
            (&local_108,0x16,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<LeafStruct_const*,unsigned_long>>
            (&local_108,0x12,(Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_>)0x0)
  ;
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_long>>
            (&local_108,0xe,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_long>>
            (&local_108,10,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)0x0);
  FlatBufferBuilderImpl<true>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,unsigned_int>>
            (&local_108,0x14,
             (Offset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<LeafStruct_const*,unsigned_int>>
            (&local_108,0x10,(Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::String>(&local_108,0xc,OVar8);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::String>
            (&local_108,8,(Offset64<flatbuffers::String>)0x0);
  FlatBufferBuilderImpl<true>::AddElement<int>(&local_108,6,0,0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_int>>
            (&local_108,4,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_>)0x0);
  uVar7 = FlatBufferBuilderImpl<true>::EndTable(&local_108,uVar7);
  FlatBufferBuilderImpl<true>::Finish(&local_108,uVar7,(char *)0x0,false);
  puVar2 = (uint *)FlatBufferBuilderImpl<true>::GetBufferPointer(&local_108);
  if (puVar2 == (uint *)0x0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)((ulong)*puVar2 + (long)puVar2);
  }
  if (*(ushort *)((long)piVar6 - (long)*piVar6) < 0xd) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)((long)piVar6 + (0xc - (long)*piVar6));
  }
  TestEqStr((char *)((long)piVar6 + (ulong)*(uint *)((long)piVar6 + (ulong)uVar1) + (ulong)uVar1 + 4
                    ),"nested: some near string",
            "\'root_table->near_string()->c_str()\' != \'\"nested: some near string\"\'",
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
            ,0x80,"");
  puVar3 = FlatBufferBuilderImpl<true>::GetBufferPointer(&local_108);
  puVar4 = FlatBufferBuilderImpl<true>::GetBufferPointer(&local_108);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_88,puVar3,
             puVar4 + local_108.buf_.size_,(allocator_type *)&local_70);
  local_108.num_field_loc = 0;
  local_108.max_voffset_ = 0;
  if (local_108.buf_.buf_ == (uint8_t *)0x0) {
    local_108.buf_.reserved_ = 0;
    puVar3 = (uint8_t *)0x0;
  }
  else {
    puVar3 = local_108.buf_.buf_ + local_108.buf_.reserved_;
  }
  local_108.buf_.cur_._0_6_ = SUB86(puVar3,0);
  local_108.buf_.cur_._6_2_ = (undefined2)((ulong)puVar3 >> 0x30);
  local_108.buf_.size_ = 0;
  local_108.buf_.scratch_._0_6_ = SUB86(local_108.buf_.buf_,0);
  local_108.buf_.scratch_._6_2_ = (undefined2)((ulong)local_108.buf_.buf_ >> 0x30);
  local_108.nested = false;
  local_108.finished = false;
  local_108.minalign_ = 1;
  local_108.length_of_64_bit_region_ = 0;
  if (local_108.string_pool != (StringOffsetMap *)0x0) {
    std::
    _Rb_tree<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::Offset<flatbuffers::String>,_std::_Identity<flatbuffers::Offset<flatbuffers::String>_>,_flatbuffers::FlatBufferBuilderImpl<true>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
    ::clear((_Rb_tree<flatbuffers::Offset<flatbuffers::String>,_flatbuffers::Offset<flatbuffers::String>,_std::_Identity<flatbuffers::Offset<flatbuffers::String>_>,_flatbuffers::FlatBufferBuilderImpl<true>::StringOffsetCompare,_std::allocator<flatbuffers::Offset<flatbuffers::String>_>_>
             *)local_108.string_pool);
  }
  v = &data<unsigned_char,std::allocator<unsigned_char>>(std::vector<unsigned_char,std::allocator<unsigned_char>>const&)
       ::t;
  if (local_80 - (long)local_88 != 0) {
    v = local_88;
  }
  off = FlatBufferBuilderImpl<true>::
        CreateVector<unsigned_char,_flatbuffers::Offset64,_flatbuffers::Vector64>
                  (&local_108,v,local_80 - (long)local_88);
  FlatBufferBuilderImpl<true>::CreateStringImpl(&local_108,"some near string",0x10);
  OVar8.o = (int)local_108.buf_.size_ - (int)local_108.length_of_64_bit_region_;
  FlatBufferBuilderImpl<true>::NotNested(&local_108);
  local_108.nested = true;
  uVar7 = (int)local_108.buf_.size_ - (int)local_108.length_of_64_bit_region_;
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_long>>
            (&local_108,0x16,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<LeafStruct_const*,unsigned_long>>
            (&local_108,0x12,(Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_long>_>)0x0)
  ;
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_long>>
            (&local_108,0xe,off);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_long>>
            (&local_108,10,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_long>_>)0x0);
  FlatBufferBuilderImpl<true>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,unsigned_int>>
            (&local_108,0x14,
             (Offset<flatbuffers::Vector<flatbuffers::Offset<WrapperTable>,_unsigned_int>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<LeafStruct_const*,unsigned_int>>
            (&local_108,0x10,(Offset64<flatbuffers::Vector<const_LeafStruct_*,_unsigned_int>_>)0x0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::String>(&local_108,0xc,OVar8);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::String>
            (&local_108,8,(Offset64<flatbuffers::String>)0x0);
  FlatBufferBuilderImpl<true>::AddElement<int>(&local_108,6,0,0);
  FlatBufferBuilderImpl<true>::AddOffset<flatbuffers::Vector<unsigned_char,unsigned_int>>
            (&local_108,4,(Offset64<flatbuffers::Vector<unsigned_char,_unsigned_int>_>)0x0);
  uVar7 = FlatBufferBuilderImpl<true>::EndTable(&local_108,uVar7);
  FlatBufferBuilderImpl<true>::Finish(&local_108,uVar7,(char *)0x0,false);
  local_70.buf_ = FlatBufferBuilderImpl<true>::GetBufferPointer(&local_108);
  local_70.size_ = local_108.buf_.size_;
  local_70.opts_.max_depth = 0x40;
  local_70.opts_.max_tables = 1000000;
  local_70.opts_.check_alignment = true;
  local_70.opts_.check_nested_flatbuffers = true;
  local_70.opts_.max_size = 0x7fffffffffffffff;
  local_70.opts_.assert = true;
  local_70.upper_bound_ = 0;
  local_70.depth_ = 0;
  local_70.num_tables_ = 0;
  local_70.flex_reuse_tracker_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  if (local_108.buf_.size_ < 0x7fffffffffffffff) {
    expval = VerifierTemplate<false>::VerifyBufferFromStart<RootTable>(&local_70,(char *)0x0,0);
    TestEq<bool,bool>(expval,true,"\'VerifyRootTableBuffer(verifier)\' != \'true\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
                      ,0xa0,"");
    puVar2 = (uint *)FlatBufferBuilderImpl<true>::GetBufferPointer(&local_108);
    if (puVar2 == (uint *)0x0) {
      piVar6 = (int *)0x0;
    }
    else {
      piVar6 = (int *)((ulong)*puVar2 + (long)puVar2);
    }
    if (*(ushort *)((long)piVar6 - (long)*piVar6) < 0xd) {
      uVar1 = 0;
    }
    else {
      uVar1 = *(ushort *)((long)piVar6 + (0xc - (long)*piVar6));
    }
    TestEqStr((char *)((long)piVar6 +
                      (ulong)*(uint *)((long)piVar6 + (ulong)uVar1) + (ulong)uVar1 + 4),
              "some near string",
              "\'root_table->near_string()->c_str()\' != \'\"some near string\"\'",
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
              ,0xa7,"");
    if (*(ushort *)((long)piVar6 - (long)*piVar6) < 0xf) {
      uVar1 = 0;
    }
    else {
      uVar1 = *(ushort *)((long)piVar6 + (0xe - (long)*piVar6));
    }
    TestEq<unsigned_long,unsigned_long>
              (*(unsigned_long *)
                ((long)piVar6 + *(long *)((long)piVar6 + (ulong)uVar1) + (ulong)uVar1),
               local_80 - (long)local_88,
               "\'root_table->nested_root()->size()\' != \'nested_data.size()\'",
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
               ,0xaa,"");
    if (*(ushort *)((long)piVar6 - (long)*piVar6) < 0xf) {
      uVar1 = 0;
    }
    else {
      uVar1 = *(ushort *)((long)piVar6 + (0xe - (long)*piVar6));
    }
    if (uVar1 == 0) {
      lVar5 = 0;
    }
    else {
      lVar5 = (long)piVar6 + *(long *)((long)piVar6 + (ulong)uVar1) + (ulong)uVar1;
    }
    if (lVar5 == 0) {
      piVar6 = (int *)0x0;
    }
    else {
      piVar6 = (int *)(lVar5 + (ulong)*(uint *)(lVar5 + 8) + 8);
    }
    if (*(ushort *)((long)piVar6 - (long)*piVar6) < 0xd) {
      uVar1 = 0;
    }
    else {
      uVar1 = *(ushort *)((long)piVar6 + (0xc - (long)*piVar6));
    }
    TestEqStr((char *)((long)piVar6 +
                      (ulong)*(uint *)((long)piVar6 + (ulong)uVar1) + (ulong)uVar1 + 4),
              "nested: some near string",
              "\'root_table->nested_root_nested_root()->near_string()->c_str()\' != \'\"nested: some near string\"\'"
              ,
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/64bit/offset64_test.cpp"
              ,0xae,"");
    if (local_88 != (uchar *)0x0) {
      operator_delete(local_88,local_78 - (long)local_88);
    }
    FlatBufferBuilderImpl<true>::~FlatBufferBuilderImpl(&local_108);
    return;
  }
  __assert_fail("size_ < opts.max_size",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/verifier.h"
                ,0x2f,
                "flatbuffers::VerifierTemplate<false>::VerifierTemplate(const uint8_t *const, const size_t, const Options &) [TrackVerifierBufferSize = false]"
               );
}

Assistant:

void Offset64NestedFlatBuffer() {
  FlatBufferBuilder64 fbb;

  // First serialize a nested buffer.
  const Offset<String> near_string_offset =
      fbb.CreateString("nested: some near string");

  // Finish by building the root table by passing in all the offsets.
  const Offset<RootTable> root_table_offset =
      CreateRootTable(fbb, 0, 0, 0, 0, near_string_offset, 0);

  // Finish the buffer.
  fbb.Finish(root_table_offset);

  // Ensure the buffer is valid.
  const RootTable *root_table = GetRootTable(fbb.GetBufferPointer());
  TEST_EQ_STR(root_table->near_string()->c_str(), "nested: some near string");

  // Copy the data out of the builder.
  std::vector<uint8_t> nested_data{ fbb.GetBufferPointer(),
                                    fbb.GetBufferPointer() + fbb.GetSize() };

  {
    // Clear so we can reuse the builder.
    fbb.Clear();

    const Offset64<Vector64<uint8_t>> nested_flatbuffer_offset =
        fbb.CreateVector64<Vector64>(nested_data);

    // Now that we are done with the 64-bit fields, we can create and add the
    // normal fields.
    const Offset<String> near_string_offset =
        fbb.CreateString("some near string");

    // Finish by building the root table by passing in all the offsets.
    const Offset<RootTable> root_table_offset = CreateRootTable(
        fbb, 0, 0, 0, 0, near_string_offset, nested_flatbuffer_offset);

    // Finish the buffer.
    fbb.Finish(root_table_offset);

    Verifier::Options options;
    // Allow the verifier to verify 64-bit buffers.
    options.max_size = FLATBUFFERS_MAX_64_BUFFER_SIZE;
    options.assert = true;

    Verifier verifier(fbb.GetBufferPointer(), fbb.GetSize(), options);

    TEST_EQ(VerifyRootTableBuffer(verifier), true);
  }

  {
    const RootTable *root_table = GetRootTable(fbb.GetBufferPointer());

    // Test that the parent buffer field is ok.
    TEST_EQ_STR(root_table->near_string()->c_str(), "some near string");

    // Expect nested buffer to be properly sized.
    TEST_EQ(root_table->nested_root()->size(), nested_data.size());

    // Expect the direct accessors to the nested buffer work.
    TEST_EQ_STR(root_table->nested_root_nested_root()->near_string()->c_str(),
                "nested: some near string");
  }
}